

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

void __thiscall IRBuilder::InsertBailOnNoProfile(IRBuilder *this,uint offset)

{
  code *pcVar1;
  Instr **this_00;
  bool bVar2;
  undefined4 *puVar3;
  Type_conflict node;
  Type *ppIVar4;
  Instr **argInstr;
  Iterator __iter;
  Type pIStack_30;
  int count;
  Instr *startCall;
  uint offset_local;
  IRBuilder *this_local;
  
  bVar2 = DoBailOnNoProfile(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                       ,0x84,"(DoBailOnNoProfile())","DoBailOnNoProfile()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  if ((this->callTreeHasSomeProfileInfo & 1U) == 0) {
    pIStack_30 = (Instr *)0x0;
    __iter.current._4_4_ = 0;
    _argInstr = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::GetIterator
                          (&this->m_argStack->
                            super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>);
    do {
      do {
        if (__iter.list == (SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar3 = 0;
        }
        this_00 = argInstr;
        node = SListNodeBase<Memory::ArenaAllocator>::Next
                         (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        bVar2 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::IsHead
                          ((SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)this_00,node
                          );
        if (bVar2) {
          if (pIStack_30 == (Instr *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar3 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                               ,0x9a,"(startCall)","startCall");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar3 = 0;
          }
          if (pIStack_30->m_prev->m_opcode == BailOnNoProfile) {
            return;
          }
          InsertBailOnNoProfile(this,pIStack_30);
          return;
        }
        SListNodeBase<Memory::ArenaAllocator>::Next
                  (&(__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>);
        ppIVar4 = SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                            ((Iterator *)&argInstr);
      } while ((*ppIVar4)->m_opcode != StartCall);
      pIStack_30 = *ppIVar4;
      __iter.current._4_4_ = __iter.current._4_4_ + 1;
    } while (__iter.current._4_4_ < 2);
  }
  return;
}

Assistant:

void
IRBuilder::InsertBailOnNoProfile(uint offset)
{
    Assert(DoBailOnNoProfile());

    if (this->callTreeHasSomeProfileInfo)
    {
        return;
    }

    IR::Instr *startCall = nullptr;
    int count = 0;
    FOREACH_SLIST_ENTRY(IR::Instr *, argInstr, this->m_argStack)
    {
        if (argInstr->m_opcode == Js::OpCode::StartCall)
        {
            startCall = argInstr;
            count++;
            if (count > 1)
            {
                return;
            }
        }
    } NEXT_SLIST_ENTRY;

    AnalysisAssert(startCall);

    if (startCall->m_prev->m_opcode != Js::OpCode::BailOnNoProfile)
    {
        InsertBailOnNoProfile(startCall);
    }
}